

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanInf.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_63b2::FloatxNanInfTest_cast_nans_Test::TestBody
          (FloatxNanInfTest_cast_nans_Test *this)

{
  char *pcVar1;
  AssertionResult gtest_ar;
  T2 b;
  T1 a;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  AssertHelper local_68;
  flexfloat_t local_60;
  undefined8 local_50;
  flexfloat_t local_48;
  flexfloat_t local_30;
  
  local_50 = 0;
  local_30.value = NAN;
  local_30.desc.exp_bits = '\x02';
  local_30.desc.frac_bits = '\x03';
  flexfloat_sanitize(&local_30);
  local_48.value = 0.0;
  local_48.desc.exp_bits = '\n';
  local_48.desc.frac_bits = '2';
  flexfloat_sanitize(&local_48);
  local_60.value = local_30.value;
  local_60.desc.exp_bits = '\n';
  local_60.desc.frac_bits = '2';
  flexfloat_sanitize(&local_60);
  local_48._10_6_ = local_60._10_6_;
  local_48.desc = local_60.desc;
  local_48.value = local_60.value;
  testing::internal::
  CmpHelperNE<flexfloat<(unsigned_char)2,(unsigned_char)3>,flexfloat<(unsigned_char)2,(unsigned_char)3>>
            ((internal *)&local_60,"a","a",
             (flexfloat<(unsigned_char)__x02_,_(unsigned_char)__x03_> *)&local_30,
             (flexfloat<(unsigned_char)__x02_,_(unsigned_char)__x03_> *)&local_30);
  if (local_60.value._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_70);
    if ((undefined8 *)CONCAT62(local_60._10_6_,local_60.desc) == (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT62(local_60._10_6_,local_60.desc);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/oprecomp[P]flexfloat/test/NanInf.cpp"
               ,0x54,pcVar1);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_70._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_70._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(local_60._10_6_,local_60.desc) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60.desc,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(local_60._10_6_,local_60.desc));
  }
  local_70._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7ff8000000000000
  ;
  testing::internal::CmpHelperNE<flexfloat<(unsigned_char)2,(unsigned_char)3>,double>
            ((internal *)&local_60,"a","fp_t(0.0 / 0.0)",
             (flexfloat<(unsigned_char)__x02_,_(unsigned_char)__x03_> *)&local_30,
             (double *)&local_70);
  if (local_60.value._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_70);
    if ((undefined8 *)CONCAT62(local_60._10_6_,local_60.desc) == (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT62(local_60._10_6_,local_60.desc);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/oprecomp[P]flexfloat/test/NanInf.cpp"
               ,0x55,pcVar1);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_70._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_70._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(local_60._10_6_,local_60.desc) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60.desc,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(local_60._10_6_,local_60.desc));
  }
  testing::internal::
  CmpHelperNE<flexfloat<(unsigned_char)10,(unsigned_char)50>,flexfloat<(unsigned_char)10,(unsigned_char)50>>
            ((internal *)&local_60,"b","b",
             (flexfloat<(unsigned_char)__n_,_(unsigned_char)_2_> *)&local_48,
             (flexfloat<(unsigned_char)__n_,_(unsigned_char)_2_> *)&local_48);
  if (local_60.value._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_70);
    if ((undefined8 *)CONCAT62(local_60._10_6_,local_60.desc) == (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT62(local_60._10_6_,local_60.desc);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/oprecomp[P]flexfloat/test/NanInf.cpp"
               ,0x59,pcVar1);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_70._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_70._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(local_60._10_6_,local_60.desc) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60.desc,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(local_60._10_6_,local_60.desc));
  }
  local_70._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7ff8000000000000
  ;
  testing::internal::CmpHelperNE<flexfloat<(unsigned_char)10,(unsigned_char)50>,double>
            ((internal *)&local_60,"b","fp_t(0.0 / 0.0)",
             (flexfloat<(unsigned_char)__n_,_(unsigned_char)_2_> *)&local_48,(double *)&local_70);
  if (local_60.value._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_70);
    if ((undefined8 *)CONCAT62(local_60._10_6_,local_60.desc) == (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT62(local_60._10_6_,local_60.desc);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/oprecomp[P]flexfloat/test/NanInf.cpp"
               ,0x5a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_70._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_70._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(local_60._10_6_,local_60.desc) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60.desc,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(local_60._10_6_,local_60.desc));
  }
  return;
}

Assistant:

TEST(FloatxNanInfTest, cast_nans)
{
    using T1 = flexfloat<2, 3>;
    #ifdef FLEXFLOAT_ON_SINGLE
    using T2 = flexfloat<7, 21>;
    #endif
    #ifdef FLEXFLOAT_ON_DOUBLE
    using T2 = flexfloat<10, 50>;
    #endif
    #ifdef FLEXFLOAT_ON_QUAD
    using T2 = flexfloat<12, 100>;
    #endif
    T1 a = 0.0 / 0.0;
    T2 b = 0.0;
    b = a;

    fp_t constnan =  nan;

    EXPECT_NE(a, a);    // holds only for NANs
    EXPECT_NE(a, nan);  // holds only for NANs
    // EXPECT_EQ(*reinterpret_cast<uint_t*>(&a),
    //           *reinterpret_cast<uint_t*>(&constnan));

    EXPECT_NE(b, b);    // holds only for NANs
    EXPECT_NE(b, nan);  // holds only for NANs

}